

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddImage
          (ImDrawList *this,ImTextureID user_texture_id,ImVec2 *a,ImVec2 *b,ImVec2 *uv_a,
          ImVec2 *uv_b,ImU32 col)

{
  ImVec2 *pIVar1;
  bool bVar2;
  value_type *ppvVar3;
  bool bVar4;
  bool push_texture_id;
  ImVec2 *uv_b_local;
  ImVec2 *uv_a_local;
  ImVec2 *b_local;
  ImVec2 *a_local;
  ImTextureID user_texture_id_local;
  ImDrawList *this_local;
  
  if ((col & 0xff000000) != 0) {
    a_local = (ImVec2 *)user_texture_id;
    user_texture_id_local = this;
    bVar2 = ImVector<void_*>::empty(&this->_TextureIdStack);
    pIVar1 = a_local;
    bVar4 = true;
    if (!bVar2) {
      ppvVar3 = ImVector<void_*>::back(&this->_TextureIdStack);
      bVar4 = pIVar1 != (ImVec2 *)*ppvVar3;
    }
    if (bVar4) {
      PushTextureID(this,&a_local);
    }
    PrimReserve(this,6,4);
    PrimRectUV(this,a,b,uv_a,uv_b,col);
    if (bVar4) {
      PopTextureID(this);
    }
  }
  return;
}

Assistant:

void ImDrawList::AddImage(ImTextureID user_texture_id, const ImVec2& a, const ImVec2& b, const ImVec2& uv_a, const ImVec2& uv_b, ImU32 col)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    // FIXME-OPT: This is wasting draw calls.
    const bool push_texture_id = _TextureIdStack.empty() || user_texture_id != _TextureIdStack.back();
    if (push_texture_id)
        PushTextureID(user_texture_id);

    PrimReserve(6, 4);
    PrimRectUV(a, b, uv_a, uv_b, col);

    if (push_texture_id)
        PopTextureID();
}